

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

bool tinyobj::LoadObjWithCallback
               (istream *inStream,callback_t *callback,void *user_data,MaterialReader *readMatFn,
               string *warn,string *err)

{
  size_t *psVar1;
  byte bVar2;
  _Rb_tree_color _Var3;
  size_t sVar4;
  pointer pbVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  code *pcVar11;
  iterator iVar12;
  long *plVar13;
  undefined8 uVar14;
  long *plVar15;
  ulong uVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *elems;
  bool bVar17;
  undefined1 auVar18 [8];
  ulong uVar19;
  byte *pbVar20;
  int *piVar21;
  byte *pbVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  pointer pbVar24;
  stringstream local_4d0 [8];
  stringstream errss;
  ios_base local_450 [264];
  undefined1 local_348 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  material_map;
  index_t idx;
  ios_base aiStack_298 [264];
  double local_190;
  undefined1 auStack_188 [8];
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  undefined1 auStack_158 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 auStack_138 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> names_out;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  undefined1 auStack_f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  pointer piStack_c8;
  vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> indices;
  undefined1 local_a8 [8];
  string linebuf;
  allocator local_79;
  istream *local_78;
  void *local_70;
  string *local_68;
  undefined1 local_60 [8];
  string namebuf;
  
  local_70 = user_data;
  local_68 = warn;
  namebuf.field_2._8_8_ = callback;
  std::__cxx11::stringstream::stringstream(local_4d0);
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&material_map;
  material_map._M_t._M_impl._0_4_ = 0;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  piStack_c8 = (pointer)0x0;
  indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_188 = (undefined1  [8])0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_158 = (undefined1  [8])0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_158,2);
  auStack_138 = (undefined1  [8])0x0;
  names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8 = (undefined1  [8])&linebuf._M_string_length;
  linebuf._M_dataplus._M_p = (pointer)0x0;
  linebuf._M_string_length._0_1_ = 0;
  local_78 = inStream;
LAB_00119193:
  do {
    while( true ) {
      do {
        do {
          piVar21 = &idx.texcoord_index;
          iVar6 = std::istream::peek();
          if (iVar6 == -1) {
            if (err != (string *)0x0) {
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::_M_append
                        ((char *)err,material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
              if ((int *)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count !=
                  &idx.texcoord_index) {
                operator_delete((void *)material_map._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count,
                                CONCAT71(stack0xfffffffffffffcf9,(undefined1)idx.texcoord_index) + 1
                               );
              }
            }
            if (local_a8 != (undefined1  [8])&linebuf._M_string_length) {
              operator_delete((void *)local_a8,
                              CONCAT71(linebuf._M_string_length._1_7_,
                                       (undefined1)linebuf._M_string_length) + 1);
            }
            if (auStack_138 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_138,
                              (long)names_out.
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)auStack_138);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_158);
            std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector
                      ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                       auStack_188);
            if (piStack_c8 != (pointer)0x0) {
              operator_delete(piStack_c8,
                              (long)indices.
                                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)piStack_c8);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_348);
            std::__cxx11::stringstream::~stringstream(local_4d0);
            std::ios_base::~ios_base(local_450);
            return true;
          }
          safeGetline(inStream,(string *)local_a8);
          auVar18 = local_a8;
          if ((linebuf._M_dataplus._M_p != (pointer)0x0) &&
             (((pointer)((long)local_a8 + -1))[(long)linebuf._M_dataplus._M_p] == '\n')) {
            linebuf._M_dataplus._M_p = linebuf._M_dataplus._M_p + -1;
            *((long)local_a8 + linebuf._M_dataplus._M_p) = '\0';
          }
          if ((linebuf._M_dataplus._M_p != (pointer)0x0) &&
             (((pointer)((long)local_a8 + -1))[(long)linebuf._M_dataplus._M_p] == '\r')) {
            linebuf._M_dataplus._M_p = linebuf._M_dataplus._M_p + -1;
            *((long)local_a8 + linebuf._M_dataplus._M_p) = '\0';
          }
        } while (linebuf._M_dataplus._M_p == (pointer)0x0);
        sVar9 = strspn((char *)local_a8," \t");
        if (auVar18 == (undefined1  [8])0x0) {
          __assert_fail("token",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/objl/tiny_obj_loader.h"
                        ,0xaa3,
                        "bool tinyobj::LoadObjWithCallback(std::istream &, const callback_t &, void *, MaterialReader *, std::string *, std::string *)"
                       );
        }
        pbVar20 = (byte *)((long)auVar18 + sVar9);
        bVar2 = *pbVar20;
      } while ((bVar2 == 0) || (bVar2 == 0x23));
      if ((bVar2 != 0x76) || ((pbVar20[1] != 0x20 && (pbVar20[1] != 9)))) break;
      sVar9 = strspn((char *)(pbVar20 + 2)," \t");
      pbVar20 = pbVar20 + sVar9 + 2;
      sVar9 = strcspn((char *)pbVar20," \t\r");
      pbVar22 = pbVar20 + sVar9;
      material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      psVar1 = &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
      tryParseDouble((char *)pbVar20,(char *)pbVar22,(double *)psVar1);
      sVar4 = material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
      sVar9 = strspn((char *)pbVar22," \t");
      pbVar22 = pbVar22 + sVar9;
      sVar9 = strcspn((char *)pbVar22," \t\r");
      pbVar20 = pbVar22 + sVar9;
      material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble((char *)pbVar22,(char *)pbVar20,(double *)psVar1);
      linebuf.field_2._8_8_ = material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
      sVar9 = strspn((char *)pbVar20," \t");
      pbVar20 = pbVar20 + sVar9;
      sVar9 = strcspn((char *)pbVar20," \t\r");
      pbVar22 = pbVar20 + sVar9;
      material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tryParseDouble((char *)pbVar20,(char *)pbVar22,(double *)psVar1);
      local_190 = (double)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
      sVar9 = strspn((char *)pbVar22," \t");
      pbVar22 = pbVar22 + sVar9;
      sVar9 = strcspn((char *)pbVar22," \t\r");
      inStream = local_78;
      material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0x3ff0000000000000;
      tryParseDouble((char *)pbVar22,(char *)(pbVar22 + sVar9),(double *)psVar1);
      if (*(code **)namebuf.field_2._8_8_ != (code *)0x0) {
        (**(code **)namebuf.field_2._8_8_)
                  ((float)(double)sVar4,(float)(double)linebuf.field_2._8_8_,(float)local_190,
                   (float)(double)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   local_70);
      }
    }
    if (bVar2 == 0x76) {
      if ((pbVar20[1] == 0x6e) && ((pbVar20[2] == 0x20 || (pbVar20[2] == 9)))) {
        sVar9 = strspn((char *)(pbVar20 + 3)," \t");
        pbVar20 = pbVar20 + sVar9 + 3;
        sVar9 = strcspn((char *)pbVar20," \t\r");
        pbVar22 = pbVar20 + sVar9;
        material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        psVar1 = &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
        tryParseDouble((char *)pbVar20,(char *)pbVar22,(double *)psVar1);
        sVar4 = material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
        sVar9 = strspn((char *)pbVar22," \t");
        pbVar22 = pbVar22 + sVar9;
        sVar9 = strcspn((char *)pbVar22," \t\r");
        inStream = local_78;
        pbVar20 = pbVar22 + sVar9;
        material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        tryParseDouble((char *)pbVar22,(char *)pbVar20,(double *)psVar1);
        linebuf.field_2._8_8_ = material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
        sVar9 = strspn((char *)pbVar20," \t");
        pbVar20 = pbVar20 + sVar9;
        sVar9 = strcspn((char *)pbVar20," \t\r");
        material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        tryParseDouble((char *)pbVar20,(char *)(pbVar20 + sVar9),(double *)psVar1);
        if (*(code **)(namebuf.field_2._8_8_ + 8) != (code *)0x0) {
          (**(code **)(namebuf.field_2._8_8_ + 8))
                    ((float)(double)sVar4,(float)(double)linebuf.field_2._8_8_,
                     (float)(double)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     local_70);
        }
        goto LAB_00119193;
      }
      if ((pbVar20[1] == 0x74) && ((pbVar20[2] == 0x20 || (pbVar20[2] == 9)))) {
        sVar9 = strspn((char *)(pbVar20 + 3)," \t");
        pbVar20 = pbVar20 + sVar9 + 3;
        sVar9 = strcspn((char *)pbVar20," \t\r");
        pbVar22 = pbVar20 + sVar9;
        material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        psVar1 = &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
        tryParseDouble((char *)pbVar20,(char *)pbVar22,(double *)psVar1);
        sVar4 = material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
        sVar9 = strspn((char *)pbVar22," \t");
        pbVar22 = pbVar22 + sVar9;
        sVar9 = strcspn((char *)pbVar22," \t\r");
        inStream = local_78;
        pbVar20 = pbVar22 + sVar9;
        material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        tryParseDouble((char *)pbVar22,(char *)pbVar20,(double *)psVar1);
        linebuf.field_2._8_8_ = material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
        sVar9 = strspn((char *)pbVar20," \t");
        pbVar20 = pbVar20 + sVar9;
        sVar9 = strcspn((char *)pbVar20," \t\r");
        material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        tryParseDouble((char *)pbVar20,(char *)(pbVar20 + sVar9),(double *)psVar1);
        if (*(code **)(namebuf.field_2._8_8_ + 0x10) != (code *)0x0) {
          (**(code **)(namebuf.field_2._8_8_ + 0x10))
                    ((float)(double)sVar4,(float)(double)linebuf.field_2._8_8_,
                     (float)(double)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     local_70);
        }
        goto LAB_00119193;
      }
    }
    if ((bVar2 == 0x66) && ((pbVar20[1] == 0x20 || (pbVar20[1] == 9)))) {
      sVar9 = strspn((char *)(pbVar20 + 2)," \t");
      if (indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
          super__Vector_impl_data._M_start != piStack_c8) {
        indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
        super__Vector_impl_data._M_start = piStack_c8;
      }
      pbVar20 = pbVar20 + sVar9 + 2;
      while ((0xd < *pbVar20 || ((0x2401U >> (*pbVar20 & 0x1f) & 1) == 0))) {
        iVar7 = atoi((char *)pbVar20);
        sVar9 = strcspn((char *)pbVar20,"/ \t\r");
        pbVar22 = pbVar20 + sVar9;
        iVar6 = 0;
        if (pbVar20[sVar9] == 0x2f) {
          if (pbVar22[1] == 0x2f) {
            pbVar22 = pbVar22 + 2;
            iVar8 = 0;
          }
          else {
            pbVar20 = pbVar22 + 1;
            iVar8 = atoi((char *)pbVar20);
            sVar9 = strcspn((char *)pbVar20,"/ \t\r");
            pbVar22 = pbVar20 + sVar9;
            if (pbVar20[sVar9] != 0x2f) goto LAB_0011974d;
            pbVar22 = pbVar22 + 1;
          }
          iVar6 = atoi((char *)pbVar22);
          sVar9 = strcspn((char *)pbVar22,"/ \t\r");
          pbVar22 = pbVar22 + sVar9;
        }
        else {
          iVar8 = 0;
          iVar6 = 0;
        }
LAB_0011974d:
        material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = CONCAT44(iVar6,iVar7);
        idx.vertex_index = iVar8;
        if (indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
            super__Vector_impl_data._M_start ==
            indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
          _M_realloc_insert<tinyobj::index_t_const&>
                    ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&piStack_c8,
                     (iterator)
                     indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (index_t *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        else {
          (indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
           super__Vector_impl_data._M_start)->texcoord_index = iVar8;
          (indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
           super__Vector_impl_data._M_start)->vertex_index = iVar7;
          (indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
           super__Vector_impl_data._M_start)->normal_index = iVar6;
          indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
          super__Vector_impl_data._M_start =
               indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
        inStream = local_78;
        sVar9 = strspn((char *)pbVar22," \t\r");
        pbVar20 = pbVar22 + sVar9;
      }
      pcVar11 = *(code **)(namebuf.field_2._8_8_ + 0x18);
      if ((pcVar11 != (code *)0x0) &&
         ((long)indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                _M_impl.super__Vector_impl_data._M_start - (long)piStack_c8 != 0)) {
        uVar16 = ((long)indices.
                        super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                        _M_impl.super__Vector_impl_data._M_start - (long)piStack_c8 >> 2) *
                 -0x5555555555555555;
        auVar18 = (undefined1  [8])piStack_c8;
LAB_00119a34:
        (*pcVar11)(local_70,auVar18,uVar16);
      }
    }
    else {
      iVar6 = strncmp((char *)pbVar20,"usemtl",6);
      if ((iVar6 == 0) && ((pbVar20[6] == 0x20 || (pbVar20[6] == 9)))) {
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        sVar9 = strlen((char *)(pbVar20 + 7));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)piVar21,(char *)(pbVar20 + 7),sVar9);
        std::__cxx11::stringbuf::str();
        iVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_348,(key_type *)local_60);
        if (iVar12._M_node == (_Base_ptr)&material_map) {
          _Var3 = ~_S_red;
          if ((local_68 != (string *)0x0) && (*(long *)(namebuf.field_2._8_8_ + 0x20) == 0)) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           auStack_f8,"material [ ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_60);
            plVar13 = (long *)std::__cxx11::string::append((char *)auStack_f8);
            plVar15 = plVar13 + 2;
            if ((long *)*plVar13 == plVar15) {
              local_108 = *plVar15;
              lStack_100 = plVar13[3];
              local_118 = &local_108;
            }
            else {
              local_108 = *plVar15;
              local_118 = (long *)*plVar13;
            }
            local_110 = plVar13[1];
            *plVar13 = (long)plVar15;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_68,(ulong)local_118);
            if (local_118 != &local_108) {
              operator_delete(local_118,local_108 + 1);
            }
            if (auStack_f8 !=
                (undefined1  [8])
                &filenames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
              operator_delete((void *)auStack_f8,
                              (ulong)((long)&((filenames.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish)->
                                             _M_dataplus)._M_p + 1));
            }
          }
        }
        else {
          _Var3 = iVar12._M_node[2]._M_color;
        }
        if (*(code **)(namebuf.field_2._8_8_ + 0x20) != (code *)0x0) {
          (**(code **)(namebuf.field_2._8_8_ + 0x20))(local_70,local_60,_Var3);
        }
LAB_00119e26:
        if (local_60 != (undefined1  [8])&namebuf._M_string_length) {
          operator_delete((void *)local_60,
                          CONCAT71(namebuf._M_string_length._1_7_,
                                   (undefined1)namebuf._M_string_length) + 1);
        }
        std::__cxx11::stringstream::~stringstream
                  ((stringstream *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::ios_base::~ios_base(aiStack_298);
      }
      else {
        iVar6 = strncmp((char *)pbVar20,"mtllib",6);
        pbVar5 = names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        auVar18 = auStack_158;
        if ((iVar6 == 0) && ((pbVar20[6] == 0x20 || (pbVar20[6] == 9)))) {
          if (readMatFn != (MaterialReader *)0x0) {
            auStack_f8 = (undefined1  [8])0x0;
            filenames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            filenames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            psVar1 = &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
            std::__cxx11::string::string
                      ((string *)psVar1,(char *)(pbVar20 + 7),(allocator *)local_60);
            SplitString((string *)psVar1,(char)auStack_f8,elems);
            if ((int *)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count != piVar21) {
              operator_delete((void *)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              CONCAT71(stack0xfffffffffffffcf9,(undefined1)idx.texcoord_index) + 1);
            }
            if (auStack_f8 ==
                (undefined1  [8])
                filenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              if (local_68 != (string *)0x0) {
                std::__cxx11::string::append((char *)local_68);
              }
            }
            else {
              if ((undefined1  [8])
                  filenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != auStack_f8) {
                lVar10 = 0;
                uVar16 = 0;
                bVar17 = false;
                do {
                  idx.vertex_index = 0;
                  idx.normal_index = 0;
                  idx.texcoord_index._0_1_ = 0;
                  local_60 = (undefined1  [8])&namebuf._M_string_length;
                  namebuf._M_dataplus._M_p = (pointer)0x0;
                  namebuf._M_string_length._0_1_ = 0;
                  material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)piVar21;
                  std::__cxx11::string::string
                            ((string *)&local_118,*(char **)((long)auStack_f8 + lVar10),&local_79);
                  iVar6 = (*readMatFn->_vptr_MaterialReader[2])
                                    (readMatFn,(string *)&local_118,auStack_188,local_348,
                                     &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                     local_60);
                  if (local_118 != &local_108) {
                    operator_delete(local_118,local_108 + 1);
                  }
                  if ((local_68 != (string *)0x0) && (idx._0_8_ != 0)) {
                    std::__cxx11::string::_M_append
                              ((char *)local_68,
                               material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
                  }
                  if ((err != (string *)0x0) && (namebuf._M_dataplus._M_p != (pointer)0x0)) {
                    std::__cxx11::string::_M_append((char *)err,(ulong)local_60);
                  }
                  if ((char)iVar6 != '\0') {
                    bVar17 = true;
                  }
                  if (local_60 != (undefined1  [8])&namebuf._M_string_length) {
                    operator_delete((void *)local_60,
                                    CONCAT71(namebuf._M_string_length._1_7_,
                                             (undefined1)namebuf._M_string_length) + 1);
                  }
                  if ((int *)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count !=
                      piVar21) {
                    operator_delete((void *)material_map._M_t._M_impl.super__Rb_tree_header.
                                            _M_node_count,
                                    CONCAT71(stack0xfffffffffffffcf9,(undefined1)idx.texcoord_index)
                                    + 1);
                  }
                  inStream = local_78;
                  if ((char)iVar6 != '\0') break;
                  uVar16 = uVar16 + 1;
                  lVar10 = lVar10 + 0x20;
                } while (uVar16 < (ulong)((long)filenames.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start -
                                          (long)auStack_f8 >> 5));
                if (bVar17) {
                  if (*(code **)(namebuf.field_2._8_8_ + 0x28) != (code *)0x0) {
                    if ((undefined1  [8])
                        materials.
                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                        ._M_impl.super__Vector_impl_data._M_start == auStack_188) {
LAB_0011a09c:
                      uVar14 = std::__throw_out_of_range_fmt
                                         ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                          ,0);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)auStack_f8);
                      if (local_a8 != (undefined1  [8])&linebuf._M_string_length) {
                        operator_delete((void *)local_a8,
                                        CONCAT71(linebuf._M_string_length._1_7_,
                                                 (undefined1)linebuf._M_string_length) + 1);
                      }
                      if (auStack_138 != (undefined1  [8])0x0) {
                        operator_delete((void *)auStack_138,
                                        (long)names_out.
                                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)auStack_138);
                      }
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)auStack_158);
                      std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::
                      ~vector((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                              auStack_188);
                      if (piStack_c8 != (pointer)0x0) {
                        operator_delete(piStack_c8,
                                        (long)indices.
                                              super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)piStack_c8);
                      }
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   *)local_348);
                      std::__cxx11::stringstream::~stringstream(local_4d0);
                      std::ios_base::~ios_base(local_450);
                      _Unwind_Resume(uVar14);
                    }
                    (**(code **)(namebuf.field_2._8_8_ + 0x28))
                              (local_70,auStack_188,
                               ((long)materials.
                                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_188
                               >> 3) * 0x63fb9aeb1fdcd759);
                  }
                  goto LAB_00119e93;
                }
              }
              if (local_68 != (string *)0x0) {
                std::__cxx11::string::append((char *)local_68);
              }
            }
LAB_00119e93:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_f8);
          }
        }
        else if (bVar2 == 0x6f) {
          if ((pbVar20[1] == 0x20) || (pbVar20[1] == 9)) {
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)
                       &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
            sVar9 = strlen((char *)(pbVar20 + 2));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&idx.texcoord_index,(char *)(pbVar20 + 2),sVar9);
            std::__cxx11::stringbuf::str();
            if (*(code **)(namebuf.field_2._8_8_ + 0x38) != (code *)0x0) {
              (**(code **)(namebuf.field_2._8_8_ + 0x38))(local_70,local_60);
            }
            goto LAB_00119e26;
          }
        }
        else if ((bVar2 == 0x67) && ((pbVar20[1] == 0x20 || (pbVar20[1] == 9)))) {
          if ((undefined1  [8])
              names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != auStack_158) {
            paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)auStack_158 + 0x10);
            do {
              plVar13 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(paVar23 + -1))->_M_dataplus)._M_p;
              if (paVar23 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar13) {
                operator_delete(plVar13,paVar23->_M_allocated_capacity + 1);
              }
              pbVar24 = (pointer)(paVar23 + 1);
              paVar23 = paVar23 + 2;
            } while (pbVar24 != pbVar5);
            names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar18;
          }
          while ((inStream = local_78, 0xd < *pbVar20 || ((0x2401U >> (*pbVar20 & 0x1f) & 1) == 0)))
          {
            local_60 = (undefined1  [8])&namebuf._M_string_length;
            namebuf._M_dataplus._M_p = (pointer)0x0;
            namebuf._M_string_length._0_1_ = 0;
            sVar9 = strspn((char *)pbVar20," \t");
            pbVar20 = pbVar20 + sVar9;
            sVar9 = strcspn((char *)pbVar20," \t\r");
            pbVar22 = pbVar20 + sVar9;
            psVar1 = &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
            material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)piVar21;
            std::__cxx11::string::_M_construct<char_const*>((string *)psVar1,pbVar20,pbVar22);
            std::__cxx11::string::operator=((string *)local_60,(string *)psVar1);
            if ((int *)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count != piVar21) {
              operator_delete((void *)material_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              CONCAT71(stack0xfffffffffffffcf9,(undefined1)idx.texcoord_index) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_158,(value_type *)local_60);
            sVar9 = strspn((char *)pbVar22," \t\r");
            if (local_60 != (undefined1  [8])&namebuf._M_string_length) {
              operator_delete((void *)local_60,
                              CONCAT71(namebuf._M_string_length._1_7_,
                                       (undefined1)namebuf._M_string_length) + 1);
            }
            pbVar20 = pbVar22 + sVar9;
          }
          if ((long)names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_158 == 0) {
            __assert_fail("names.size() > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/objl/tiny_obj_loader.h"
                          ,0xb42,
                          "bool tinyobj::LoadObjWithCallback(std::istream &, const callback_t &, void *, MaterialReader *, std::string *, std::string *)"
                         );
          }
          if (*(code **)(namebuf.field_2._8_8_ + 0x30) != (code *)0x0) {
            uVar16 = (long)names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start - (long)auStack_158 >> 5;
            if (1 < uVar16) {
              std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)auStack_138,
                         uVar16 - 1);
              if ((undefined1  [8])
                  names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start == auStack_138) {
                uVar16 = 0;
              }
              else {
                lVar10 = 0x20;
                uVar19 = 0;
                do {
                  *(undefined8 *)((int *)auStack_138 + uVar19 * 2) =
                       *(undefined8 *)((long)&((_Alloc_hider *)auStack_158)->_M_p + lVar10);
                  uVar19 = uVar19 + 1;
                  uVar16 = (long)names_out.
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start - (long)auStack_138 >> 3;
                  lVar10 = lVar10 + 0x20;
                } while (uVar19 < uVar16);
              }
              if ((undefined1  [8])
                  names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start == auStack_138) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,uVar16);
                goto LAB_0011a09c;
              }
              pcVar11 = *(code **)(namebuf.field_2._8_8_ + 0x30);
              auVar18 = auStack_138;
              goto LAB_00119a34;
            }
            (**(code **)(namebuf.field_2._8_8_ + 0x30))(local_70,0,0);
          }
        }
      }
    }
  } while( true );
}

Assistant:

bool LoadObjWithCallback(std::istream &inStream, const callback_t &callback,
                         void *user_data /*= NULL*/,
                         MaterialReader *readMatFn /*= NULL*/,
                         std::string *warn, /* = NULL*/
                         std::string *err /*= NULL*/) {
  std::stringstream errss;

  // material
  std::map<std::string, int> material_map;
  int material_id = -1;  // -1 = invalid

  std::vector<index_t> indices;
  std::vector<material_t> materials;
  std::vector<std::string> names;
  names.reserve(2);
  std::vector<const char *> names_out;

  std::string linebuf;
  while (inStream.peek() != -1) {
    safeGetline(inStream, linebuf);

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // vertex
    if (token[0] == 'v' && IS_SPACE((token[1]))) {
      token += 2;
      // TODO(syoyo): Support parsing vertex color extension.
      real_t x, y, z, w;  // w is optional. default = 1.0
      parseV(&x, &y, &z, &w, &token);
      if (callback.vertex_cb) {
        callback.vertex_cb(user_data, x, y, z, w);
      }
      continue;
    }

    // normal
    if (token[0] == 'v' && token[1] == 'n' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;
      parseReal3(&x, &y, &z, &token);
      if (callback.normal_cb) {
        callback.normal_cb(user_data, x, y, z);
      }
      continue;
    }

    // texcoord
    if (token[0] == 'v' && token[1] == 't' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;  // y and z are optional. default = 0.0
      parseReal3(&x, &y, &z, &token);
      if (callback.texcoord_cb) {
        callback.texcoord_cb(user_data, x, y, z);
      }
      continue;
    }

    // face
    if (token[0] == 'f' && IS_SPACE((token[1]))) {
      token += 2;
      token += strspn(token, " \t");

      indices.clear();
      while (!IS_NEW_LINE(token[0])) {
        vertex_index_t vi = parseRawTriple(&token);

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        indices.push_back(idx);
        size_t n = strspn(token, " \t\r");
        token += n;
      }

      if (callback.index_cb && indices.size() > 0) {
        callback.index_cb(user_data, &indices.at(0),
                          static_cast<int>(indices.size()));
      }

      continue;
    }

    // use mtl
    if ((0 == strncmp(token, "usemtl", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      std::stringstream ss;
      ss << token;
      std::string namebuf = ss.str();

      int newMaterialId = -1;
      std::map<std::string, int>::const_iterator it = material_map.find(namebuf);
      if (it != material_map.end()) {
        newMaterialId = it->second;
      } else {
        // { warn!! material not found }
        if (warn && (!callback.usemtl_cb)) {
          (*warn) += "material [ " + namebuf + " ] not found in .mtl\n";
        }
      }

      if (newMaterialId != material_id) {
        material_id = newMaterialId;
      }

      if (callback.usemtl_cb) {
        callback.usemtl_cb(user_data, namebuf.c_str(), material_id);
      }

      continue;
    }

    // load mtl
    if ((0 == strncmp(token, "mtllib", 6)) && IS_SPACE((token[6]))) {
      if (readMatFn) {
        token += 7;

        std::vector<std::string> filenames;
        SplitString(std::string(token), ' ', filenames);

        if (filenames.empty()) {
          if (warn) {
            (*warn) +=
                "Looks like empty filename for mtllib. Use default "
                "material. \n";
          }
        } else {
          bool found = false;
          for (size_t s = 0; s < filenames.size(); s++) {
            std::string warn_mtl;
            std::string err_mtl;
            bool ok = (*readMatFn)(filenames[s].c_str(), &materials,
                                   &material_map, &warn_mtl, &err_mtl);

            if (warn && (!warn_mtl.empty())) {
              (*warn) += warn_mtl;  // This should be warn message.
            }

            if (err && (!err_mtl.empty())) {
              (*err) += err_mtl;
            }

            if (ok) {
              found = true;
              break;
            }
          }

          if (!found) {
            if (warn) {
              (*warn) +=
                  "Failed to load material file(s). Use default "
                  "material.\n";
            }
          } else {
            if (callback.mtllib_cb) {
              callback.mtllib_cb(user_data, &materials.at(0),
                                 static_cast<int>(materials.size()));
            }
          }
        }
      }

      continue;
    }

    // group name
    if (token[0] == 'g' && IS_SPACE((token[1]))) {
      names.clear();

      while (!IS_NEW_LINE(token[0])) {
        std::string str = parseString(&token);
        names.push_back(str);
        token += strspn(token, " \t\r");  // skip tag
      }

      assert(names.size() > 0);

      if (callback.group_cb) {
        if (names.size() > 1) {
          // create const char* array.
          names_out.resize(names.size() - 1);
          for (size_t j = 0; j < names_out.size(); j++) {
            names_out[j] = names[j + 1].c_str();
          }
          callback.group_cb(user_data, &names_out.at(0),
                            static_cast<int>(names_out.size()));

        } else {
          callback.group_cb(user_data, NULL, 0);
        }
      }

      continue;
    }

    // object name
    if (token[0] == 'o' && IS_SPACE((token[1]))) {
      // @todo { multiple object name? }
      token += 2;

      std::stringstream ss;
      ss << token;
      std::string object_name = ss.str();

      if (callback.object_cb) {
        callback.object_cb(user_data, object_name.c_str());
      }

      continue;
    }

#if 0  // @todo
    if (token[0] == 't' && IS_SPACE(token[1])) {
      tag_t tag;

      token += 2;
      std::stringstream ss;
      ss << token;
      tag.name = ss.str();

      token += tag.name.size() + 1;

      tag_sizes ts = parseTagTriple(&token);

      tag.intValues.resize(static_cast<size_t>(ts.num_ints));

      for (size_t i = 0; i < static_cast<size_t>(ts.num_ints); ++i) {
        tag.intValues[i] = atoi(token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.floatValues.resize(static_cast<size_t>(ts.num_reals));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_reals); ++i) {
        tag.floatValues[i] = parseReal(&token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.stringValues.resize(static_cast<size_t>(ts.num_strings));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_strings); ++i) {
        std::stringstream ss;
        ss << token;
        tag.stringValues[i] = ss.str();
        token += tag.stringValues[i].size() + 1;
      }

      tags.push_back(tag);
    }
#endif

    // Ignore unknown command.
  }

  if (err) {
    (*err) += errss.str();
  }

  return true;
}